

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::SendRequest_Diagnostics
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 SubFunction,U16 Data)

{
  int iVar1;
  char cVar2;
  U16 UVar3;
  ushort uVar4;
  U16 LRCvalue;
  U16 CRCValue;
  U16 Data_local;
  U16 SubFunction_local;
  U8 DeviceID_local;
  ModbusSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  if ((this->mSettings->mModbusMode == ModbusRTUClient) ||
     (this->mSettings->mModbusMode == ModbusRTUServer)) {
    CreateModbusByte(this,(ulong)DeviceID);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,8);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(SubFunction & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(SubFunction & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(Data & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(Data & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    UVar3 = update_CRC(this,0xffff,DeviceID);
    UVar3 = update_CRC(this,UVar3,'\b');
    UVar3 = update_CRC(this,UVar3,(U8)SubFunction);
    UVar3 = update_CRC(this,UVar3,(U8)(SubFunction >> 8));
    UVar3 = update_CRC(this,UVar3,(U8)Data);
    UVar3 = update_CRC(this,UVar3,(U8)(Data >> 8));
    CreateModbusByte(this,(long)(int)(UVar3 & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(UVar3 & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else {
    uVar4 = (DeviceID + 8 + (SubFunction & 0xff) + (SubFunction >> 8) + (Data & 0xff) + (Data >> 8)
            ^ 0xffff) + 1;
    CreateModbusByte(this,0x3a);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(uint)DeviceID >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,DeviceID & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x30);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x38);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(SubFunction & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((SubFunction & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(SubFunction & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(SubFunction & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(Data & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((Data & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(Data & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(Data & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)((uVar4 & 0xff) & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(byte)uVar4 & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendRequest_Diagnostics( U8 DeviceID, U16 SubFunction, U16 Data )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x08 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( SubFunction & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( SubFunction & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Data & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Data & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x08 );
        CRCValue = update_CRC( CRCValue, SubFunction & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( SubFunction & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Data & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Data & 0xFF00 ) >> 8 );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x08;
        LRCvalue = LRCvalue + ( SubFunction & 0x00FF );
        LRCvalue = LRCvalue + ( ( SubFunction & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Data & 0x00FF );
        LRCvalue = LRCvalue + ( ( Data & 0xFF00 ) >> 8 );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '0' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '8' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( SubFunction & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( SubFunction & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( SubFunction & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( SubFunction & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Data & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Data & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Data & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Data & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}